

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void DLevelScript::ReplaceTextures(int fromnamei,int tonamei,int flags)

{
  sector_t *psVar1;
  FTextureID FVar2;
  FTextureID FVar3;
  char *name;
  char *name_00;
  FTextureID *pFVar4;
  long lVar5;
  FTextureID *pFVar6;
  int j;
  long lVar7;
  int i;
  
  name = FBehavior::StaticLookupString(fromnamei);
  name_00 = FBehavior::StaticLookupString(tonamei);
  if (name != (char *)0x0) {
    if (flags != 7) {
      FVar2 = FTextureManager::GetTexture(&TexMan,name,1,2);
      FVar3 = FTextureManager::GetTexture(&TexMan,name_00,1,2);
      pFVar4 = &sides->textures[0].texture;
      for (lVar5 = 0; lVar5 < numsides; lVar5 = lVar5 + 1) {
        pFVar6 = pFVar4;
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          if ((((uint)"\x04\x02\x01"[lVar7] & flags) == 0) && (pFVar6->texnum == FVar2.texnum)) {
            pFVar6->texnum = FVar3.texnum;
          }
          pFVar6 = pFVar6 + 0xc;
        }
        pFVar4 = pFVar4 + 0x36;
      }
      if (flags == 0x18) {
        return;
      }
    }
    FVar2 = FTextureManager::GetTexture(&TexMan,name,2,2);
    FVar3 = FTextureManager::GetTexture(&TexMan,name_00,2,2);
    lVar5 = 0;
    for (lVar7 = 0; psVar1 = sectors, lVar7 < numsectors; lVar7 = lVar7 + 1) {
      if (((flags & 8U) == 0) &&
         (*(int *)((long)&sectors->planes[0].Texture.texnum + lVar5) == FVar2.texnum)) {
        sector_t::SetTexture
                  ((sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar5),0,FVar3,true);
      }
      if (((flags & 0x10U) == 0) &&
         (*(int *)((long)&psVar1->planes[1].Texture.texnum + lVar5) == FVar2.texnum)) {
        *(int *)((long)&psVar1->planes[1].Texture.texnum + lVar5) = FVar3.texnum;
      }
      lVar5 = lVar5 + 0x268;
    }
  }
  return;
}

Assistant:

void DLevelScript::ReplaceTextures (int fromnamei, int tonamei, int flags)
{
	const char *fromname = FBehavior::StaticLookupString (fromnamei);
	const char *toname = FBehavior::StaticLookupString (tonamei);
	FTextureID picnum1, picnum2;

	if (fromname == NULL)
		return;

	if ((flags ^ (NOT_BOTTOM | NOT_MIDDLE | NOT_TOP)) != 0)
	{
		picnum1 = TexMan.GetTexture (fromname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);
		picnum2 = TexMan.GetTexture (toname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);

		for (int i = 0; i < numsides; ++i)
		{
			side_t *wal = &sides[i];

			for(int j=0;j<3;j++)
			{
				static BYTE bits[]={NOT_TOP, NOT_MIDDLE, NOT_BOTTOM};
				if (!(flags & bits[j]) && wal->GetTexture(j) == picnum1)
				{
					wal->SetTexture(j, picnum2);
				}
			}
		}
	}
	if ((flags ^ (NOT_FLOOR | NOT_CEILING)) != 0)
	{
		picnum1 = TexMan.GetTexture (fromname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);
		picnum2 = TexMan.GetTexture (toname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);

		for (int i = 0; i < numsectors; ++i)
		{
			sector_t *sec = &sectors[i];

			if (!(flags & NOT_FLOOR) && sec->GetTexture(sector_t::floor) == picnum1) 
				sec->SetTexture(sector_t::floor, picnum2);
			if (!(flags & NOT_CEILING) && sec->GetTexture(sector_t::ceiling) == picnum1)	
				sec->SetTexture(sector_t::ceiling, picnum2);
		}
	}
}